

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

Vec_Int_t * Vec_IntStart(int nSize)

{
  Vec_Int_t *pVVar1;
  int *__s;
  int iVar2;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < nSize - 1U) {
    iVar2 = nSize;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
  }
  pVVar1->pArray = __s;
  pVVar1->nSize = nSize;
  memset(__s,0,(long)nSize << 2);
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStart( int nSize )
{
    Vec_Int_t * p;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(int) * nSize );
    return p;
}